

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_math.c
# Opt level: O0

int jpc_fix_firstone(jpc_fix_t x)

{
  int local_14;
  jpc_fix_t jStack_10;
  int n;
  jpc_fix_t x_local;
  
  if (-1 < x) {
    local_14 = -1;
    for (jStack_10 = x; 0 < jStack_10; jStack_10 = jStack_10 >> 1) {
      local_14 = local_14 + 1;
    }
    return local_14;
  }
  __assert_fail("x >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_math.c"
                ,0x7b,"int jpc_fix_firstone(jpc_fix_t)");
}

Assistant:

int jpc_fix_firstone(jpc_fix_t x)
{
	int n;

	/* The argument must be nonnegative. */
	assert(x >= 0);

	n = -1;
	while (x > 0) {
		x >>= 1;
		++n;
	}
	return n;
}